

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O0

int __thiscall Patch::Node::copy(Node *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  Node *left;
  Node *right;
  bool bVar1;
  Node *this_00;
  Text *pTVar2;
  type pTVar3;
  unique_ptr<Text,_std::default_delete<Text>_> local_68;
  undefined1 local_59;
  Text *local_58;
  unique_ptr<Text,_std::default_delete<Text>_> local_40;
  Point local_38;
  Point local_30;
  Point local_28;
  Point local_20;
  Node *result;
  Node *this_local;
  
  result = this;
  this_00 = (Node *)operator_new(0x50);
  left = this->left;
  right = this->right;
  local_20 = this->old_extent;
  local_28 = this->new_extent;
  local_30 = this->old_distance_from_left_ancestor;
  local_38 = this->new_distance_from_left_ancestor;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->old_text);
  local_59 = 0;
  if (bVar1) {
    pTVar2 = (Text *)operator_new(0x38);
    local_59 = 1;
    local_58 = pTVar2;
    pTVar3 = std::unique_ptr<Text,_std::default_delete<Text>_>::operator*(&this->old_text);
    Text::Text(pTVar2,pTVar3);
    std::unique_ptr<Text,std::default_delete<Text>>::unique_ptr<std::default_delete<Text>,void>
              ((unique_ptr<Text,std::default_delete<Text>> *)&local_40,pTVar2);
  }
  else {
    std::unique_ptr<Text,std::default_delete<Text>>::unique_ptr<std::default_delete<Text>,void>
              ((unique_ptr<Text,std::default_delete<Text>> *)&local_40,(nullptr_t)0x0);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->new_text);
  if (bVar1) {
    pTVar2 = (Text *)operator_new(0x38);
    pTVar3 = std::unique_ptr<Text,_std::default_delete<Text>_>::operator*(&this->new_text);
    Text::Text(pTVar2,pTVar3);
    std::unique_ptr<Text,std::default_delete<Text>>::unique_ptr<std::default_delete<Text>,void>
              ((unique_ptr<Text,std::default_delete<Text>> *)&local_68,pTVar2);
  }
  else {
    std::unique_ptr<Text,std::default_delete<Text>>::unique_ptr<std::default_delete<Text>,void>
              ((unique_ptr<Text,std::default_delete<Text>> *)&local_68,(nullptr_t)0x0);
  }
  Node(this_00,left,right,local_20,local_28,local_30,local_38,&local_40,&local_68,
       this->old_text_size_);
  std::unique_ptr<Text,_std::default_delete<Text>_>::~unique_ptr(&local_68);
  std::unique_ptr<Text,_std::default_delete<Text>_>::~unique_ptr(&local_40);
  this_00->old_subtree_text_size = this->old_subtree_text_size;
  this_00->new_subtree_text_size = this->new_subtree_text_size;
  return (int)this_00;
}

Assistant:

Node *copy() {
    auto result = new Node{
      left,
      right,
      old_extent,
      new_extent,
      old_distance_from_left_ancestor,
      new_distance_from_left_ancestor,
      old_text ? unique_ptr<Text>(new Text(*old_text)) : nullptr,
      new_text ? unique_ptr<Text>(new Text(*new_text)) : nullptr,
      old_text_size_,
    };
    result->old_subtree_text_size = old_subtree_text_size;
    result->new_subtree_text_size = new_subtree_text_size;
    return result;
  }